

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::Serialize(StatsdPullAtomConfig *this,Message *msg)

{
  bool bVar1;
  reference pAVar2;
  reference piVar3;
  reference str;
  void *data;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  int *it_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  AtomId *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_> *__range2;
  Message *msg_local;
  StatsdPullAtomConfig *this_local;
  
  __end2 = std::
           vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>::
           begin(&this->pull_atom_id_);
  it = (AtomId *)
       std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>::
       end(&this->pull_atom_id_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_perfetto::protos::gen::AtomId_*,_std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>_>
                                     *)&it), bVar1) {
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_perfetto::protos::gen::AtomId_*,_std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>_>
             ::operator*(&__end2);
    protozero::Message::AppendVarInt<perfetto::protos::gen::AtomId>(msg,1,*pAVar2);
    __gnu_cxx::
    __normal_iterator<const_perfetto::protos::gen::AtomId_*,_std::vector<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<int,_std::allocator<int>_>::begin(&this->raw_pull_atom_id_);
  it_1 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->raw_pull_atom_id_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)&it_1), bVar1) {
    piVar3 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&__end2_1);
    protozero::Message::AppendVarInt<int>(msg,2,*piVar3);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2_1);
  }
  bVar1 = std::bitset<5UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,3,this->pull_frequency_ms_);
  }
  __end2_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->packages_);
  it_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->packages_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_2,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&it_2), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end2_2);
    protozero::Message::AppendString(msg,4,str);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2_2);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void StatsdPullAtomConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: pull_atom_id
  for (auto& it : pull_atom_id_) {
    msg->AppendVarInt(1, it);
  }

  // Field 2: raw_pull_atom_id
  for (auto& it : raw_pull_atom_id_) {
    msg->AppendVarInt(2, it);
  }

  // Field 3: pull_frequency_ms
  if (_has_field_[3]) {
    msg->AppendVarInt(3, pull_frequency_ms_);
  }

  // Field 4: packages
  for (auto& it : packages_) {
    msg->AppendString(4, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}